

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view input,bool cap_next_letter,
          bool preserve_period)

{
  size_type sVar1;
  const_reference pvVar2;
  long lVar3;
  char *pcVar4;
  int local_28;
  byte local_21;
  int i;
  bool preserve_period_local;
  bool cap_next_letter_local;
  string_view input_local;
  string *result;
  
  input_local._M_len = input._M_len;
  local_21 = (byte)input._M_str & 1;
  _i = this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0;
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&i),
      (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
    if ((*pvVar2 < 'a') ||
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28),
       'z' < *pvVar2)) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
      if ((*pvVar2 < 'A') ||
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28)
         , 'Z' < *pvVar2)) {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
        if ((*pvVar2 < '0') ||
           (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&i,
                                (long)local_28), '9' < *pvVar2)) {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28)
          ;
          if ((*pvVar2 == '.') && (cap_next_letter)) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
          }
        }
        else {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28)
          ;
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
        }
        local_21 = 1;
      }
      else {
        if ((local_28 == 0) && (local_21 == 0)) {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,0);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2 + ' ');
        }
        else {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28)
          ;
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
        }
        local_21 = 0;
      }
    }
    else {
      if (local_21 == 0) {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
      }
      else {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2 + -0x20);
      }
      local_21 = 0;
    }
  }
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&i);
  if (sVar1 != 0) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&i);
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&i,sVar1 - 1);
    if (*pvVar2 == '#') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
    }
  }
  lVar3 = std::__cxx11::string::size();
  if ((((lVar3 != 0) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
       '/' < *pcVar4)) &&
      (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
      *pcVar4 < ':')) &&
     ((sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&i), sVar1 != 0 &&
      (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                          ((basic_string_view<char,_std::char_traits<char>_> *)&i,0), *pvVar2 == '_'
      )))) {
    std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(absl::string_view input,
                                   bool cap_next_letter, bool preserve_period) {
  std::string result;

  // Note:  I distrust ctype.h due to locales.
  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      if (i == 0 && !cap_next_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += input[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
      if (input[i] == '.' && preserve_period) {
        result += '.';
      }
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (input.size() > 0 && input[input.size() - 1] == '#') {
    result += '_';
  }

  // https://github.com/protocolbuffers/protobuf/issues/8101
  // To avoid generating invalid identifiers - if the input string
  // starts with _<digit> (or multiple underscores then digit) then
  // we need to preserve the underscore as an identifier cannot start
  // with a digit.
  // This check is being done after the loop rather than before
  // to handle the case where there are multiple underscores before the
  // first digit. We let them all be consumed so we can see if we would
  // start with a digit.
  // Note: not preserving leading underscores for all otherwise valid identifiers
  // so as to not break anything that relies on the existing behaviour
  if (result.size() > 0 && ('0' <= result[0] && result[0] <= '9')
      && input.size() > 0 && input[0] == '_')
  {
      result.insert(0, 1, '_');
  }
  return result;
}